

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddMousePosEvent(ImGuiIO *this,float x,float y)

{
  long in_RDI;
  float in_XMM0_Da;
  float _y;
  float in_XMM1_Da;
  ImGuiInputEvent e;
  ImVec2 latest_pos;
  ImGuiInputEvent *latest_event;
  ImVec2 pos;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffa8;
  float fVar1;
  int in_stack_ffffffffffffffb8;
  ImGuiInputEventType in_stack_ffffffffffffffbc;
  ImVec2 local_30;
  ImGuiInputEvent *local_28;
  ImVec2 local_20;
  ImGuiContext *local_18;
  float local_10;
  
  local_18 = GImGui;
  if ((*(byte *)(in_RDI + 0x37a1) & 1) != 0) {
    local_10 = in_XMM1_Da;
    if (-3.4028235e+38 < in_XMM0_Da) {
      in_XMM0_Da = ImFloorSigned(in_XMM0_Da);
    }
    _y = local_10;
    fVar1 = in_XMM0_Da;
    if (-3.4028235e+38 < local_10) {
      _y = ImFloorSigned(local_10);
    }
    ImVec2::ImVec2(&local_20,in_XMM0_Da,_y);
    local_28 = FindLatestInputEvent(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    if (local_28 == (ImGuiInputEvent *)0x0) {
      local_30 = (local_18->IO).MousePos;
    }
    else {
      ImVec2::ImVec2(&local_30,(local_28->field_2).MousePos.PosX,(local_28->field_2).MousePos.PosY);
    }
    if ((local_30.x == local_20.x) && (!NAN(local_30.x) && !NAN(local_20.x))) {
      if ((local_30.y == local_20.y) && (!NAN(local_30.y) && !NAN(local_20.y))) {
        return;
      }
    }
    ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x4a0121);
    ImVector<ImGuiInputEvent>::push_back
              ((ImVector<ImGuiInputEvent> *)CONCAT44(fVar1,in_XMM0_Da),
               (ImGuiInputEvent *)CONCAT44(_y,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

void ImGuiIO::AddMousePosEvent(float x, float y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (!AppAcceptingEvents)
        return;

    // Apply same flooring as UpdateMouseInputs()
    ImVec2 pos((x > -FLT_MAX) ? ImFloorSigned(x) : x, (y > -FLT_MAX) ? ImFloorSigned(y) : y);

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_MousePos);
    const ImVec2 latest_pos = latest_event ? ImVec2(latest_event->MousePos.PosX, latest_event->MousePos.PosY) : g.IO.MousePos;
    if (latest_pos.x == pos.x && latest_pos.y == pos.y)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.MousePos.PosX = pos.x;
    e.MousePos.PosY = pos.y;
    g.InputEventsQueue.push_back(e);
}